

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O3

void nn_mutex_init(nn_mutex_t *self)

{
  int iVar1;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_14;
  
  pthread_mutexattr_init(&local_14);
  iVar1 = pthread_mutexattr_settype(&local_14,2);
  if (iVar1 == 0) {
    iVar1 = pthread_mutex_init((pthread_mutex_t *)self,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      pthread_mutexattr_destroy(&local_14);
      return;
    }
  }
  else {
    nn_mutex_init_cold_1();
  }
  nn_mutex_init_cold_2();
}

Assistant:

void nn_mutex_init (nn_mutex_t *self)
{
    int rc;
    pthread_mutexattr_t attr;

    pthread_mutexattr_init(&attr);
    rc = pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_ERRORCHECK);
    errnum_assert (rc == 0, rc);
    rc = pthread_mutex_init (&self->mutex, NULL);
    errnum_assert (rc == 0, rc);
    pthread_mutexattr_destroy(&attr);
}